

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool background_thread_boot1(tsdn_t *tsdn)

{
  _Bool _Var1;
  int iVar2;
  base_t *base;
  bool bVar3;
  background_thread_info_t *info;
  uint uVar4;
  ulong uVar5;
  background_thread_info_t *pbVar6;
  
  if (0xfff < opt_max_background_threads) {
    opt_max_background_threads = 4;
  }
  background_thread_enabled_state.repr = opt_background_thread;
  max_background_threads = opt_max_background_threads;
  _Var1 = malloc_mutex_init(&background_thread_lock,"background_thread_global",4,
                            malloc_mutex_rank_exclusive);
  bVar3 = true;
  if (!_Var1) {
    base = b0get();
    background_thread_info =
         (background_thread_info_t *)base_alloc(tsdn,base,opt_max_background_threads * 0xd0,0x40);
    if (background_thread_info != (background_thread_info_t *)0x0) {
      uVar4 = 0;
      while( true ) {
        pbVar6 = background_thread_info;
        uVar5 = (ulong)uVar4;
        bVar3 = uVar5 < max_background_threads;
        if (max_background_threads <= uVar5) break;
        info = (background_thread_info_t *)&background_thread_info[uVar5].mtx;
        _Var1 = malloc_mutex_init((malloc_mutex_t *)info,"background_thread",0xb,
                                  malloc_mutex_address_ordered);
        if (_Var1) {
          return bVar3;
        }
        pbVar6 = pbVar6 + uVar5;
        iVar2 = pthread_cond_init((pthread_cond_t *)&pbVar6->cond,(pthread_condattr_t *)0x0);
        if (iVar2 != 0) {
          return bVar3;
        }
        malloc_mutex_lock(tsdn,(malloc_mutex_t *)info);
        pbVar6->state = background_thread_stopped;
        background_thread_info_init((tsdn_t *)pbVar6,info);
        (pbVar6->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar6->mtx).field_0 + 0x40));
        uVar4 = uVar4 + 1;
      }
    }
  }
  return bVar3;
}

Assistant:

bool
background_thread_boot1(tsdn_t *tsdn) {
#ifdef JEMALLOC_BACKGROUND_THREAD
	assert(have_background_thread);
	assert(narenas_total_get() > 0);

	if (opt_max_background_threads > MAX_BACKGROUND_THREAD_LIMIT) {
		opt_max_background_threads = DEFAULT_NUM_BACKGROUND_THREAD;
	}
	max_background_threads = opt_max_background_threads;

	background_thread_enabled_set(tsdn, opt_background_thread);
	if (malloc_mutex_init(&background_thread_lock,
	    "background_thread_global",
	    WITNESS_RANK_BACKGROUND_THREAD_GLOBAL,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	background_thread_info = (background_thread_info_t *)base_alloc(tsdn,
	    b0get(), opt_max_background_threads *
	    sizeof(background_thread_info_t), CACHELINE);
	if (background_thread_info == NULL) {
		return true;
	}

	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		/* Thread mutex is rank_inclusive because of thread0. */
		if (malloc_mutex_init(&info->mtx, "background_thread",
		    WITNESS_RANK_BACKGROUND_THREAD,
		    malloc_mutex_address_ordered)) {
			return true;
		}
		if (pthread_cond_init(&info->cond, NULL)) {
			return true;
		}
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
#endif

	return false;
}